

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O3

void __thiscall Unit::operator+=(Unit *this,Unit *u)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  
  if (this->bInvalid != false) {
    return;
  }
  lVar3 = 1;
  bVar1 = false;
  do {
    if (this->siUnits[lVar3 + -1] != u->siUnits[lVar3 + -1]) {
      this->bInvalid = true;
      bVar1 = true;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  if (this->nExpPrefix == u->nExpPrefix) {
    if (!bVar1) {
      return;
    }
  }
  else {
    this->bInvalid = true;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"warning: trying to add ",0x17);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(u->sUnitName)._M_dataplus._M_p,
                      (u->sUnitName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(u->sUnitSymbol)._M_dataplus._M_p,(u->sUnitSymbol)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") to ",5);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(this->sUnitName)._M_dataplus._M_p,(this->sUnitName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(this->sUnitSymbol)._M_dataplus._M_p,
                      (this->sUnitSymbol)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void Unit::operator+=(const Unit& u)
{
	if(!bInvalid) {
		for(int i=0; i<7; i++)
			if(siUnits[i] != u.siUnits[i])
				bInvalid = true;
		if(nExpPrefix != u.nExpPrefix)
			bInvalid = true;
	} else 
		return;
	if(bInvalid)
		cout << "warning: trying to add "
			<< u.sUnitName << " (" << u.sUnitSymbol << ") to "
			<< sUnitName << " (" << sUnitSymbol << ")" 
			<< endl;
}